

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

string * pbrt::ResolveFilename(string *__return_storage_ptr__,string *filename)

{
  path pStack_98;
  path local_70;
  path local_48;
  
  if ((searchDirectory._8_8_ != searchDirectory._16_8_) && (filename->_M_string_length != 0)) {
    filesystem::path::path(&pStack_98,filename);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pStack_98.m_path);
    if (pStack_98.m_absolute != true) {
      filesystem::path::path(&local_48,filename);
      filesystem::path::operator/(&local_70,(path *)searchDirectory,&local_48);
      filesystem::path::make_absolute(&pStack_98,&local_70);
      filesystem::path::str_abi_cxx11_(__return_storage_ptr__,&pStack_98,native_path);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pStack_98.m_path);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70.m_path);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48.m_path);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  return __return_storage_ptr__;
}

Assistant:

std::string ResolveFilename(const std::string &filename) {
    if (searchDirectory.empty() || filename.empty())
        return filename;
    else if (IsAbsolutePath(filename))
        return filename;
    else
        return (searchDirectory / filesystem::path(filename)).make_absolute().str();
}